

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tui.cc
# Opt level: O0

int print_bar(WINDOW *w,int y,int x,int size,double vol,char ch_on,char ch_off,int attr_on)

{
  int iVar1;
  undefined7 in_register_00000081;
  double dVar2;
  undefined1 local_61;
  bool gt;
  double ref;
  int i;
  char ch_off_local;
  char ch_on_local;
  double vol_local;
  int size_local;
  int x_local;
  int y_local;
  WINDOW *w_local;
  
  if (size < 2) {
    w_local._4_4_ = -1;
  }
  else {
    iVar1 = wmove(w,y,x,CONCAT71(in_register_00000081,ch_on) & 0xffffffff,w,attr_on);
    if (iVar1 == -1) {
      w_local._4_4_ = -1;
    }
    else {
      waddch(w,0x5b);
      for (ref._0_4_ = 0; ref._0_4_ < size + -2; ref._0_4_ = ref._0_4_ + 1) {
        dVar2 = (double)ref._0_4_ / (double)(size + -2);
        local_61 = ch_off;
        if (dVar2 < vol) {
          wattr_on(w,attr_on,0);
          local_61 = ch_on;
        }
        waddch(w,(int)local_61);
        if (dVar2 < vol) {
          wattr_off(w,attr_on,0);
        }
      }
      waddch(w,0x5d);
      w_local._4_4_ = 0;
    }
  }
  return w_local._4_4_;
}

Assistant:

static int print_bar(
    WINDOW *w, int y, int x, int size,
    double vol, char ch_on, char ch_off, int attr_on)
{
    if (size < 2)
        return ERR;
    if (wmove(w, y, x) == ERR)
        return ERR;
    waddch(w, '[');
    for (int i = 0; i < size - 2; ++i) {
        double ref = (double)i / (size - 2);
        bool gt = vol > ref;
        if (gt) wattron(w, attr_on);
        waddch(w, gt ? ch_on : ch_off);
        if (gt) wattroff(w, attr_on);
    }
    waddch(w, ']');
    return OK;
}